

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_slice.c
# Opt level: O0

MPP_RET h264e_reorder_wr_op(H264eReorderInfo *info,H264eRplmo *op)

{
  int iVar1;
  RK_S32 RVar2;
  H264eRplmo *pHVar3;
  H264eRplmo *op_local;
  H264eReorderInfo *info_local;
  
  if (info->wr_cnt < info->size) {
    iVar1 = info->wr_cnt;
    info->wr_cnt = iVar1 + 1;
    pHVar3 = info->ops + iVar1;
    RVar2 = op->abs_diff_pic_num_minus1;
    pHVar3->modification_of_pic_nums_idc = op->modification_of_pic_nums_idc;
    pHVar3->abs_diff_pic_num_minus1 = RVar2;
    RVar2 = op->abs_diff_view_idx_minus1;
    pHVar3->long_term_pic_idx = op->long_term_pic_idx;
    pHVar3->abs_diff_view_idx_minus1 = RVar2;
    info_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,"h264e_slice","write too many reorder op %d vs %d\n","h264e_reorder_wr_op",
               (ulong)(uint)info->wr_cnt,(ulong)(uint)info->size);
    info_local._4_4_ = MPP_NOK;
  }
  return info_local._4_4_;
}

Assistant:

MPP_RET h264e_reorder_wr_op(H264eReorderInfo *info, H264eRplmo *op)
{
    if (info->wr_cnt >= info->size) {
        mpp_err_f("write too many reorder op %d vs %d\n",
                  info->wr_cnt, info->size);
        return MPP_NOK;
    }

    info->ops[info->wr_cnt++] = *op;
    return MPP_OK;
}